

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineArguments.cxx
# Opt level: O0

void __thiscall
cmsys::CommandLineArguments::GetUnusedArguments(CommandLineArguments *this,int *argc,char ***argv)

{
  undefined1 auVar1 [16];
  size_type sVar2;
  ulong uVar3;
  char **ppcVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  char **ppcVar8;
  String *str;
  int cnt;
  char **args;
  size_type cc;
  size_type size;
  char ***argv_local;
  int *argc_local;
  CommandLineArguments *this_local;
  
  sVar2 = std::vector<cmsys::String,_std::allocator<cmsys::String>_>::size
                    (&(this->Internals->UnusedArguments).
                      super_vector<cmsys::String,_std::allocator<cmsys::String>_>);
  auVar1._8_8_ = 0;
  auVar1._0_8_ = sVar2 + 1;
  uVar3 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar3 = 0xffffffffffffffff;
  }
  ppcVar4 = (char **)operator_new__(uVar3);
  lVar5 = std::__cxx11::string::size();
  pcVar6 = (char *)operator_new__(lVar5 + 1);
  *ppcVar4 = pcVar6;
  pcVar6 = *ppcVar4;
  pcVar7 = (char *)std::__cxx11::string::c_str();
  strcpy(pcVar6,pcVar7);
  str._4_4_ = 1;
  args = (char **)0x0;
  while( true ) {
    ppcVar8 = (char **)std::vector<cmsys::String,_std::allocator<cmsys::String>_>::size
                                 (&(this->Internals->UnusedArguments).
                                   super_vector<cmsys::String,_std::allocator<cmsys::String>_>);
    if (ppcVar8 <= args) break;
    std::vector<cmsys::String,_std::allocator<cmsys::String>_>::operator[]
              (&(this->Internals->UnusedArguments).
                super_vector<cmsys::String,_std::allocator<cmsys::String>_>,(size_type)args);
    lVar5 = std::__cxx11::string::size();
    pcVar6 = (char *)operator_new__(lVar5 + 1);
    ppcVar4[str._4_4_] = pcVar6;
    pcVar6 = ppcVar4[str._4_4_];
    pcVar7 = (char *)std::__cxx11::string::c_str();
    strcpy(pcVar6,pcVar7);
    str._4_4_ = str._4_4_ + 1;
    args = (char **)((long)args + 1);
  }
  *argc = str._4_4_;
  *argv = ppcVar4;
  return;
}

Assistant:

void CommandLineArguments::GetUnusedArguments(int* argc, char*** argv)
{
  CommandLineArguments::Internal::VectorOfStrings::size_type size 
    = this->Internals->UnusedArguments.size() + 1;
  CommandLineArguments::Internal::VectorOfStrings::size_type cc;

  // Copy Argv0 as the first argument
  char** args = new char*[ size ];
  args[0] = new char[ this->Internals->Argv0.size() + 1 ];
  strcpy(args[0], this->Internals->Argv0.c_str());
  int cnt = 1;

  // Copy everything after the LastArgument, since that was not parsed.
  for ( cc = 0;
    cc < this->Internals->UnusedArguments.size(); cc ++ )
    {
    kwsys::String &str = this->Internals->UnusedArguments[cc];
    args[cnt] = new char[ str.size() + 1];
    strcpy(args[cnt], str.c_str());
    cnt ++;
    }
  *argc = cnt;
  *argv = args;
}